

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O0

void csc2dense(CUPDLPdense *dense,CUPDLPcsc *csc)

{
  cupdlp_int iMatElem;
  cupdlp_int iCol;
  cupdlp_int iRow;
  CUPDLPcsc *csc_local;
  CUPDLPdense *dense_local;
  
  dense->nRows = csc->nRows;
  dense->nCols = csc->nCols;
  iMatElem = 0;
  for (iCol = 0; iCol < dense->nCols; iCol = iCol + 1) {
    for (iRow = 0; iRow < dense->nRows; iRow = iRow + 1) {
      if (iRow == csc->colMatIdx[iMatElem]) {
        dense->data[iRow * dense->nCols + iCol] = csc->colMatElem[iMatElem];
        iMatElem = iMatElem + 1;
      }
      else {
        dense->data[iRow * dense->nCols + iCol] = 0.0;
      }
    }
  }
  return;
}

Assistant:

void csc2dense(CUPDLPdense *dense, CUPDLPcsc *csc) {
  dense->nRows = csc->nRows;
  dense->nCols = csc->nCols;

  cupdlp_int iRow = 0;
  cupdlp_int iCol = 0;
  cupdlp_int iMatElem = 0;
  for (iCol = 0; iCol < dense->nCols; ++iCol)
    for (iRow = 0; iRow < dense->nRows; ++iRow) {
      if (iRow == csc->colMatIdx[iMatElem]) {
        dense->data[iRow * dense->nCols + iCol] = csc->colMatElem[iMatElem];
        ++iMatElem;
      } else {
        dense->data[iRow * dense->nCols + iCol] = 0;
      }
    }

  return;
}